

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

void __thiscall
StatsByIP::StatsByIP
          (StatsByIP *this,uint8_t *addr,size_t addr_len,bool has_do,bool has_edns,
          bool not_qname_mini,bool is_recursive_query)

{
  bool is_recursive_query_local;
  bool not_qname_mini_local;
  bool has_edns_local;
  size_t sStack_20;
  bool has_do_local;
  size_t addr_len_local;
  uint8_t *addr_local;
  StatsByIP *this_local;
  
  this->_vptr_StatsByIP = (_func_int **)&PTR__StatsByIP_00223400;
  this->HashNext = (StatsByIP *)0x0;
  this->count = 1;
  this->hash = 0;
  this->nb_do = (uint)has_do;
  this->nb_edns = (uint)has_edns;
  this->nb_not_qname_mini = (uint)not_qname_mini;
  this->nb_recursive_queries = (uint)is_recursive_query;
  this->nb_tcp_443 = 0;
  this->nb_tcp_583 = 0;
  this->query_seen = false;
  this->response_seen = false;
  this->option_mask = 0;
  sStack_20 = addr_len;
  if (0x10 < addr_len) {
    sStack_20 = 0x10;
  }
  memcpy(this->addr,addr,sStack_20);
  this->addr_len = sStack_20;
  return;
}

Assistant:

StatsByIP::StatsByIP(const uint8_t* addr, size_t addr_len, bool has_do, bool has_edns,
    bool not_qname_mini, bool is_recursive_query) :
    HashNext(NULL),
    count(1),
    hash(0),
    nb_do((has_do) ? 1 : 0),
    nb_edns((has_edns) ? 1 : 0),
    nb_not_qname_mini((not_qname_mini) ? 1 : 0),
    nb_recursive_queries((is_recursive_query) ? 1 : 0),
    nb_tcp_443(0),
    nb_tcp_583(0),
    query_seen(false),
    response_seen(false),
    option_mask(0)
{
    if (addr_len > 16)
    {
        addr_len = 16;
    }

    memcpy(this->addr, addr, addr_len);
    this->addr_len = addr_len;
}